

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O0

void TestCipher(EVP_CIPHER *cipher,Operation input_op,bool padding,Span<const_unsigned_char> key,
               Span<const_unsigned_char> iv,Span<const_unsigned_char> plaintext,
               Span<const_unsigned_char> ciphertext,Span<const_unsigned_char> aad,
               Span<const_unsigned_char> tag)

{
  initializer_list<Operation> __l;
  initializer_list<Operation> __l_00;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  reference pOVar5;
  char *message;
  size_t sVar6;
  ScopedTrace local_14a;
  bool local_149;
  ScopedTrace gtest_trace_405;
  const_iterator pbStack_148;
  bool copy;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<bool> local_130;
  initializer_list<bool> *local_120;
  initializer_list<bool> *__range4;
  ScopedTrace gtest_trace_403;
  const_iterator pbStack_110;
  bool in_place;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<bool> local_f8;
  initializer_list<bool> *local_e8;
  initializer_list<bool> *__range3;
  ulong uStack_d8;
  ScopedTrace gtest_trace_397;
  size_t chunk_size;
  size_t *__end2;
  size_t *__begin2;
  size_t (*__range2) [17];
  ScopedTrace gtest_trace_392;
  iterator iStack_b0;
  Operation op;
  iterator __end1;
  iterator __begin1;
  vector<Operation,_std::allocator<Operation>_> *__range1;
  iterator local_90;
  undefined8 local_88;
  Operation local_70 [2];
  iterator local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  vector<Operation,_std::allocator<Operation>_> ops;
  size_t block_size;
  bool padding_local;
  Operation input_op_local;
  EVP_CIPHER *cipher_local;
  Span<const_unsigned_char> key_local;
  
  uVar4 = EVP_CIPHER_block_size((EVP_CIPHER *)cipher);
  ops.super__Vector_base<Operation,_std::allocator<Operation>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(ulong)uVar4;
  std::vector<Operation,_std::allocator<Operation>_>::vector
            ((vector<Operation,_std::allocator<Operation>_> *)local_58);
  if (input_op == kBoth) {
    local_70[0] = kEncrypt;
    local_70[1] = 2;
    local_68 = local_70;
    local_60 = 2;
    __l_00._M_len = 2;
    __l_00._M_array = local_68;
    std::vector<Operation,_std::allocator<Operation>_>::operator=
              ((vector<Operation,_std::allocator<Operation>_> *)local_58,__l_00);
  }
  else {
    local_90 = (iterator)((long)&__range1 + 4);
    local_88 = 1;
    __l._M_len = 1;
    __l._M_array = local_90;
    __range1._4_4_ = input_op;
    std::vector<Operation,_std::allocator<Operation>_>::operator=
              ((vector<Operation,_std::allocator<Operation>_> *)local_58,__l);
  }
  __end1 = std::vector<Operation,_std::allocator<Operation>_>::begin
                     ((vector<Operation,_std::allocator<Operation>_> *)local_58);
  iStack_b0 = std::vector<Operation,_std::allocator<Operation>_>::end
                        ((vector<Operation,_std::allocator<Operation>_> *)local_58);
  while (bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff50), bVar3) {
    pOVar5 = __gnu_cxx::
             __normal_iterator<Operation_*,_std::vector<Operation,_std::allocator<Operation>_>_>::
             operator*(&__end1);
    __range2._4_4_ = *pOVar5;
    message = OperationToString(__range2._4_4_);
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)((long)&__range2 + 3),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x188,message);
    for (__end2 = TestCipher::kChunkSizes;
        __end2 != (size_t *)"ZN32CipherTest_WycheproofAESCBC_Test8TestBodyEvE3$_0";
        __end2 = __end2 + 1) {
      uStack_d8 = *__end2;
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                ((ScopedTrace *)((long)&__range3 + 7),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x18d,&stack0xffffffffffffff28);
      uVar1 = uStack_d8;
      sVar6 = bssl::Span<const_unsigned_char>::size(&plaintext);
      uVar2 = uStack_d8;
      if (((sVar6 < uVar1) &&
          (sVar6 = bssl::Span<const_unsigned_char>::size(&ciphertext), uVar1 = uStack_d8,
          sVar6 < uVar2)) && (sVar6 = bssl::Span<const_unsigned_char>::size(&aad), sVar6 < uVar1)) {
        __range3._0_4_ = 5;
      }
      else {
        __begin3._6_1_ = 0;
        __begin3._7_1_ = 1;
        local_f8._M_array = (iterator)((long)&__begin3 + 6);
        local_f8._M_len = 2;
        local_e8 = &local_f8;
        __end3 = std::initializer_list<bool>::begin(local_e8);
        pbStack_110 = std::initializer_list<bool>::end(local_e8);
        for (; __end3 != pbStack_110; __end3 = __end3 + 1) {
          __range4._7_1_ = *__end3 & 1;
          testing::ScopedTrace::ScopedTrace<bool>
                    ((ScopedTrace *)((long)&__range4 + 6),
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x193,(bool *)((long)&__range4 + 7));
          __begin4._6_1_ = 0;
          __begin4._7_1_ = 1;
          local_130._M_array = (iterator)((long)&__begin4 + 6);
          local_130._M_len = 2;
          local_120 = &local_130;
          __end4 = std::initializer_list<bool>::begin(local_120);
          pbStack_148 = std::initializer_list<bool>::end(local_120);
          for (; __end4 != pbStack_148; __end4 = __end4 + 1) {
            local_149 = (bool)(*__end4 & 1);
            testing::ScopedTrace::ScopedTrace<bool>
                      (&local_14a,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x195,&local_149);
            TestCipherAPI(cipher,__range2._4_4_,padding,(bool)(local_149 & 1),
                          (bool)(__range4._7_1_ & 1),false,uStack_d8,key,iv,plaintext,ciphertext,aad
                          ,tag);
            if ((!padding) &&
               (uStack_d8 %
                (ulong)ops.super__Vector_base<Operation,_std::allocator<Operation>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage == 0)) {
              TestCipherAPI(cipher,__range2._4_4_,padding,(bool)(local_149 & 1),
                            (bool)(__range4._7_1_ & 1),true,uStack_d8,key,iv,plaintext,ciphertext,
                            aad,tag);
            }
            testing::ScopedTrace::~ScopedTrace(&local_14a);
          }
          if (!padding) {
            TestLowLevelAPI(cipher,__range2._4_4_,(bool)(__range4._7_1_ & 1),uStack_d8,key,iv,
                            plaintext,ciphertext);
          }
          testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&__range4 + 6));
        }
        __range3._0_4_ = 0;
      }
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&__range3 + 7));
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&__range2 + 3));
    __gnu_cxx::__normal_iterator<Operation_*,_std::vector<Operation,_std::allocator<Operation>_>_>::
    operator++(&__end1);
  }
  std::vector<Operation,_std::allocator<Operation>_>::~vector
            ((vector<Operation,_std::allocator<Operation>_> *)local_58);
  return;
}

Assistant:

static void TestCipher(const EVP_CIPHER *cipher, Operation input_op,
                       bool padding, bssl::Span<const uint8_t> key,
                       bssl::Span<const uint8_t> iv,
                       bssl::Span<const uint8_t> plaintext,
                       bssl::Span<const uint8_t> ciphertext,
                       bssl::Span<const uint8_t> aad,
                       bssl::Span<const uint8_t> tag) {
  size_t block_size = EVP_CIPHER_block_size(cipher);
  std::vector<Operation> ops;
  if (input_op == Operation::kBoth) {
    ops = {Operation::kEncrypt, Operation::kDecrypt};
  } else {
    ops = {input_op};
  }
  for (Operation op : ops) {
    SCOPED_TRACE(OperationToString(op));
    // Zero indicates a single-shot API.
    static const size_t kChunkSizes[] = {0,  1,  2,  5,  7,  8,  9,  15, 16,
                                         17, 31, 32, 33, 63, 64, 65, 512};
    for (size_t chunk_size : kChunkSizes) {
      SCOPED_TRACE(chunk_size);
      if (chunk_size > plaintext.size() && chunk_size > ciphertext.size() &&
          chunk_size > aad.size()) {
        continue;
      }
      for (bool in_place : {false, true}) {
        SCOPED_TRACE(in_place);
        for (bool copy : {false, true}) {
          SCOPED_TRACE(copy);
          TestCipherAPI(cipher, op, padding, copy, in_place,
                        /*use_evp_cipher=*/false, chunk_size, key, iv,
                        plaintext, ciphertext, aad, tag);
          if (!padding && chunk_size % block_size == 0) {
            TestCipherAPI(cipher, op, padding, copy, in_place,
                          /*use_evp_cipher=*/true, chunk_size, key, iv,
                          plaintext, ciphertext, aad, tag);
          }
        }
        if (!padding) {
          TestLowLevelAPI(cipher, op, in_place, chunk_size, key, iv, plaintext,
                          ciphertext);
        }
      }
    }
  }
}